

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<Fad<double>_>::TPZVec(TPZVec<Fad<double>_> *this,int64_t size,Fad<double> *copy)

{
  double *pdVar1;
  int64_t *piVar2;
  Fad<double> *this_00;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181ee50;
  this->fStore = (Fad<double> *)0x0;
  if (size < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZVec<Fad<double>>::TPZVec(const int64_t, const T &) [TVar = Fad<double>]",0x4a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n",0x23);
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else if (size == 0) {
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    lVar3 = 0;
    piVar2 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3b != 0) | size * 0x20 | 8);
    *piVar2 = size;
    this_00 = (Fad<double> *)(piVar2 + 1);
    do {
      Fad<double>::Fad(this_00);
      lVar3 = lVar3 + -0x20;
      this_00 = this_00 + 1;
    } while (-lVar3 != size * 0x20);
    this->fStore = (Fad<double> *)(piVar2 + 1);
    this->fNElements = size;
    this->fNAlloc = size;
    if (size != 0) {
      lVar3 = 0;
      do {
        pdVar1 = (double *)((long)&this->fStore->val_ + lVar3);
        *pdVar1 = copy->val_;
        Vector<double>::operator=((Vector<double> *)(pdVar1 + 1),&copy->dx_);
        pdVar1[3] = copy->defaultVal;
        lVar3 = lVar3 + 0x20;
        size = size + -1;
      } while (size != 0);
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}